

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse_Args.cpp
# Opt level: O3

void __thiscall Nova::Parse_Args::Print_Usage(Parse_Args *this,bool do_exit)

{
  pointer pAVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  pointer pbVar6;
  size_type *psVar7;
  pointer pbVar8;
  long lVar9;
  pointer pAVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  
  poVar4 = Log::(anonymous_namespace)::cerr;
  std::__ostream_insert<char,std::char_traits<char>>(Log::(anonymous_namespace)::cerr,"Usage: ",7);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(this->program_name)._M_dataplus._M_p,
                      (this->program_name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  pAVar10 = (this->arg_data_list).
            super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->arg_data_list).super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>.
      _M_impl.super__Vector_impl_data._M_finish != pAVar10) {
    lVar9 = 0;
    uVar12 = 0;
    do {
      Arg_Data::Print_Synopsis((Arg_Data *)((long)&pAVar10->type + lVar9));
      std::__ostream_insert<char,std::char_traits<char>>(Log::(anonymous_namespace)::cerr," ",1);
      uVar12 = uVar12 + 1;
      pAVar10 = (this->arg_data_list).
                super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->arg_data_list).
                     super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pAVar10 >> 3) * 0x6f96f96f96f96f97;
      lVar9 = lVar9 + 0x138;
    } while (uVar12 <= uVar5 && uVar5 - uVar12 != 0);
  }
  pbVar6 = (this->extra_args_synopsis_list).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->extra_args_synopsis_list).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar6) {
    lVar9 = 8;
    uVar12 = 0;
    do {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (Log::(anonymous_namespace)::cerr,*(char **)((long)pbVar6 + lVar9 + -8),
                          *(long *)((long)&(pbVar6->_M_dataplus)._M_p + lVar9));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      uVar12 = uVar12 + 1;
      pbVar6 = (this->extra_args_synopsis_list).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x20;
    } while (uVar12 < (ulong)((long)(this->extra_args_synopsis_list).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5))
    ;
  }
  cVar2 = (char)Log::(anonymous_namespace)::cerr;
  std::ios::widen((char)*(undefined8 *)(*(long *)Log::(anonymous_namespace)::cerr + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  pAVar10 = (this->arg_data_list).
            super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>._M_impl.
            super__Vector_impl_data._M_start;
  pAVar1 = (this->arg_data_list).super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar9 = (long)pAVar1 - (long)pAVar10;
  if (lVar9 == 0) {
    iVar11 = 0;
  }
  else {
    lVar9 = (lVar9 >> 3) * 0x6f96f96f96f96f97;
    lVar9 = lVar9 + (ulong)(lVar9 == 0);
    psVar7 = &(pAVar10->str)._M_string_length;
    iVar11 = 0;
    do {
      iVar3 = (int)*psVar7;
      if ((int)*psVar7 < iVar11) {
        iVar3 = iVar11;
      }
      iVar11 = iVar3;
      psVar7 = psVar7 + 0x27;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  pbVar6 = (this->extra_args_desc_list).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar8 = (this->extra_args_desc_list).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pbVar8 - (long)pbVar6 != 0) {
    lVar9 = (long)pbVar8 - (long)pbVar6 >> 5;
    lVar9 = lVar9 + (ulong)(lVar9 == 0);
    psVar7 = &((this->extra_args_synopsis_list).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    do {
      iVar3 = (int)*psVar7;
      if ((int)*psVar7 < iVar11) {
        iVar3 = iVar11;
      }
      iVar11 = iVar3;
      psVar7 = psVar7 + 4;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  if (pAVar1 != pAVar10) {
    lVar9 = 0;
    uVar12 = 0;
    do {
      Arg_Data::Print_Description((Arg_Data *)((long)&pAVar10->type + lVar9),iVar11 + 2);
      cVar2 = (char)Log::(anonymous_namespace)::cerr;
      std::ios::widen((char)*(undefined8 *)(*(long *)Log::(anonymous_namespace)::cerr + -0x18) +
                      cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      uVar12 = uVar12 + 1;
      pAVar10 = (this->arg_data_list).
                super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->arg_data_list).
                     super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pAVar10 >> 3) * 0x6f96f96f96f96f97;
      lVar9 = lVar9 + 0x138;
    } while (uVar12 <= uVar5 && uVar5 - uVar12 != 0);
    pbVar6 = (this->extra_args_desc_list).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar8 = (this->extra_args_desc_list).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pbVar8 != pbVar6) {
    uVar12 = 0;
    do {
      pbVar6 = (this->extra_args_synopsis_list).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>
                (Log::(anonymous_namespace)::cerr,pbVar6[uVar12]._M_dataplus._M_p,
                 pbVar6[uVar12]._M_string_length);
      if ((this->extra_args_synopsis_list).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_string_length != (ulong)(iVar11 + 2))
      {
        uVar5 = 2;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(Log::(anonymous_namespace)::cerr," ",1)
          ;
          bVar13 = uVar5 <= (ulong)(iVar11 + 2) -
                            (this->extra_args_synopsis_list).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_string_length;
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (bVar13);
      }
      pbVar6 = (this->extra_args_desc_list).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (Log::(anonymous_namespace)::cerr,pbVar6[uVar12]._M_dataplus._M_p,
                          pbVar6[uVar12]._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)(this->extra_args_desc_list).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->extra_args_desc_list).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (this->extra_usage_callback != (_func_void *)0x0) {
    (*this->extra_usage_callback)();
  }
  if (do_exit) {
    exit(-1);
  }
  return;
}

Assistant:

void Parse_Args::
Print_Usage(bool do_exit) const
{
    int i;
    Log::cerr<<"Usage: "<<program_name<<" ";
    for(i=0;i<arg_data_list.size();i++)
    {
        arg_data_list[i].Print_Synopsis();
        Log::cerr<<" ";
    }
    for(i=0;i<extra_args_synopsis_list.size();i++) Log::cerr<<extra_args_synopsis_list[i]<<" ";
    Log::cerr<<std::endl;

    int width=0,len;
    for(i=0;i<arg_data_list.size();i++)
    {
        len=(int)arg_data_list[i].str.length();
        if(len>width) width=len;
    }
    for(i=0;i<extra_args_desc_list.size();i++)
    {
        len=(int)extra_args_synopsis_list[i].length();
        if(len>width) width=len;
    }
    for(i=0;i<arg_data_list.size();i++)
    {
        arg_data_list[i].Print_Description(width+2);
        Log::cerr<<std::endl;
    }
    for(i=0;i<extra_args_desc_list.size();i++)
    {
        Log::cerr<<extra_args_synopsis_list[i];
        for(unsigned j=1;j<=width+2-extra_args_synopsis_list[i].length();j++) Log::cerr<<" ";
        Log::cerr<<extra_args_desc_list[i]<<std::endl;
    }
    if(extra_usage_callback) extra_usage_callback();
    if(do_exit) exit(-1);
}